

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

int64_t select_tx_size_and_type
                  (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,BLOCK_SIZE bsize,
                  int64_t ref_best_rd)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  MACROBLOCKD *xd_00;
  ENTROPY_CONTEXT *ta;
  TXFM_CONTEXT *pTVar10;
  BLOCK_SIZE in_CL;
  RD_STATS *in_RDX;
  undefined8 unaff_RBX;
  uint uVar11;
  long in_RSI;
  long in_RDI;
  TXFM_CONTEXT *in_R8;
  int64_t final_rd;
  RD_STATS pn_rd_stats;
  int is_cost_valid;
  int64_t best_rd_sofar;
  int idx;
  int idy;
  int block;
  int64_t no_skip_txfm_rd;
  int64_t skip_txfm_rd;
  int skip_txfm_cost;
  int no_skip_txfm_cost;
  int skip_ctx;
  int step;
  int bw;
  int bh;
  TX_SIZE max_tx_size;
  int init_depth;
  TXFM_CONTEXT tx_left [32];
  TXFM_CONTEXT tx_above [32];
  ENTROPY_CONTEXT ctxl [32];
  ENTROPY_CONTEXT ctxa [32];
  int mi_height;
  int mi_width;
  macroblockd_plane *pd;
  FAST_TX_SEARCH_MODE ftxs_mode;
  int64_t rd_thresh;
  int fast_tx_search;
  TxfmSearchParams *txfm_params;
  MACROBLOCKD *xd;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  macroblockd_plane *in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  int local_190;
  int local_154;
  int local_150;
  long local_148;
  long local_140;
  undefined1 local_118 [32];
  undefined1 local_f8 [35];
  TX_SIZE in_stack_ffffffffffffff2b;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  undefined7 in_stack_ffffffffffffff38;
  FAST_TX_SEARCH_MODE in_stack_ffffffffffffff3f;
  AV1_COMP *in_stack_ffffffffffffff40;
  BLOCK_SIZE in_stack_ffffffffffffff4f;
  RD_STATS *in_stack_ffffffffffffff50;
  MACROBLOCK *in_stack_ffffffffffffff58;
  AV1_COMP *in_stack_ffffffffffffff60;
  BLOCK_SIZE in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffc8;
  long lVar12;
  
  xd_00 = (MACROBLOCKD *)(in_RSI + 0x1a0);
  ta = (ENTROPY_CONTEXT *)(in_RSI + 0x24dcc);
  bVar5 = *(char *)(in_RSI + 0x24de4) != '\0';
  if (in_R8 == (TXFM_CONTEXT *)0x0) {
    av1_invalid_rd_stats(in_RDX);
    lVar12 = 0x7fffffffffffffff;
  }
  else {
    pTVar10 = in_R8;
    if (((bVar5) && ((long)in_R8 < 0x7fffffffffffffff)) &&
       ((long)in_R8 >> 3 < 0x7fffffffffffffff - (long)in_R8)) {
      pTVar10 = in_R8 + ((long)in_R8 >> 3);
    }
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_CL];
    bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_CL];
    av1_get_entropy_contexts
              ((BLOCK_SIZE)((ulong)in_stack_fffffffffffffdf0 >> 0x38),in_stack_fffffffffffffde8,
               (ENTROPY_CONTEXT *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               (ENTROPY_CONTEXT *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    memcpy(local_f8,xd_00->above_txfm_context,(long)(int)(uint)bVar1);
    memcpy(local_118,xd_00->left_txfm_context,(long)(int)(uint)bVar2);
    iVar6 = get_search_init_depth
                      ((uint)bVar1,(uint)bVar2,1,(SPEED_FEATURES *)(in_RDI + 0x608c0),
                       (uint)(byte)ta[0x18]);
    iVar9 = tx_size_high_unit[""[in_CL]];
    iVar3 = tx_size_wide_unit[""[in_CL]];
    iVar7 = av1_get_skip_txfm_context(xd_00);
    iVar4 = *(int *)(in_RSI + 0x8c80 + (long)iVar7 * 8);
    iVar7 = *(int *)(in_RSI + 0x8c84 + (long)iVar7 * 8);
    local_140 = (long)iVar7 * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9;
    local_148 = (long)iVar4 * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9;
    av1_init_rd_stats(in_RDX);
    for (local_150 = 0; iVar8 = max_block_high(xd_00,in_CL,0), local_150 < iVar8;
        local_150 = iVar9 + local_150) {
      for (local_154 = 0; iVar8 = max_block_wide(xd_00,in_CL,0), local_154 < iVar8;
          local_154 = iVar3 + local_154) {
        uVar11 = (uint)in_CL;
        iVar8 = iVar6;
        select_tx_block(in_stack_ffffffffffffff40,
                        (MACROBLOCK *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                        in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
                        in_stack_ffffffffffffff2c,in_stack_ffffffffffffff2b,(int)pTVar10,
                        in_stack_ffffffffffffff88,ta,(ENTROPY_CONTEXT *)xd_00,in_R8,
                        (TXFM_CONTEXT *)CONCAT17(in_CL,in_stack_ffffffffffffffa8),in_RDX,in_RSI,
                        in_RDI,in_stack_ffffffffffffffc8,(FAST_TX_SEARCH_MODE)unaff_RBX);
        if (local_190 == 0x7fffffff) {
          av1_invalid_rd_stats(in_RDX);
          return 0x7fffffffffffffff;
        }
        av1_merge_rd_stats((RD_STATS *)CONCAT44(in_stack_fffffffffffffde4,uVar11),
                           (RD_STATS *)CONCAT44(in_stack_fffffffffffffddc,iVar8));
        local_140 = ((long)iVar7 * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
                    in_RDX->sse * 0x80;
        local_148 = ((long)(in_RDX->rate + iVar4) * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
                    in_RDX->dist * 0x80;
      }
    }
    if (in_RDX->rate == 0x7fffffff) {
      lVar12 = 0x7fffffffffffffff;
    }
    else {
      in_RDX->skip_txfm = local_140 <= local_148;
      if (((bVar5) && (*(int *)(in_RDI + 0x60c0c) != 0)) &&
         (iVar9 = inter_block_yrd(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                  in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f,
                                  (int64_t)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f),
         iVar9 == 0)) {
        lVar12 = 0x7fffffffffffffff;
      }
      else if (in_RDX->skip_txfm == '\0') {
        lVar12 = ((long)(in_RDX->rate + iVar4) * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
                 in_RDX->dist * 0x80;
        if ((xd_00->lossless[(byte)*(undefined2 *)&(*xd_00->mi)->field_0xa7 & 7] == 0) &&
           (((long)iVar7 * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) + in_RDX->sse * 0x80 <=
            lVar12)) {
          lVar12 = ((long)iVar7 * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) + in_RDX->sse * 0x80
          ;
        }
      }
      else {
        lVar12 = ((long)iVar7 * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) + in_RDX->sse * 0x80;
      }
    }
  }
  return lVar12;
}

Assistant:

static int64_t select_tx_size_and_type(const AV1_COMP *cpi, MACROBLOCK *x,
                                       RD_STATS *rd_stats, BLOCK_SIZE bsize,
                                       int64_t ref_best_rd) {
  MACROBLOCKD *const xd = &x->e_mbd;
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  assert(is_inter_block(xd->mi[0]));
  assert(bsize < BLOCK_SIZES_ALL);
  const int fast_tx_search = txfm_params->tx_size_search_method > USE_FULL_RD;
  int64_t rd_thresh = ref_best_rd;
  if (rd_thresh == 0) {
    av1_invalid_rd_stats(rd_stats);
    return INT64_MAX;
  }
  if (fast_tx_search && rd_thresh < INT64_MAX) {
    if (INT64_MAX - rd_thresh > (rd_thresh >> 3)) rd_thresh += (rd_thresh >> 3);
  }
  assert(rd_thresh > 0);
  const FAST_TX_SEARCH_MODE ftxs_mode =
      fast_tx_search ? FTXS_DCT_AND_1D_DCT_ONLY : FTXS_NONE;
  const struct macroblockd_plane *const pd = &xd->plane[0];
  assert(bsize < BLOCK_SIZES_ALL);
  const int mi_width = mi_size_wide[bsize];
  const int mi_height = mi_size_high[bsize];
  ENTROPY_CONTEXT ctxa[MAX_MIB_SIZE];
  ENTROPY_CONTEXT ctxl[MAX_MIB_SIZE];
  TXFM_CONTEXT tx_above[MAX_MIB_SIZE];
  TXFM_CONTEXT tx_left[MAX_MIB_SIZE];
  av1_get_entropy_contexts(bsize, pd, ctxa, ctxl);
  memcpy(tx_above, xd->above_txfm_context, sizeof(TXFM_CONTEXT) * mi_width);
  memcpy(tx_left, xd->left_txfm_context, sizeof(TXFM_CONTEXT) * mi_height);
  const int init_depth = get_search_init_depth(
      mi_width, mi_height, 1, &cpi->sf, txfm_params->tx_size_search_method);
  const TX_SIZE max_tx_size = max_txsize_rect_lookup[bsize];
  const int bh = tx_size_high_unit[max_tx_size];
  const int bw = tx_size_wide_unit[max_tx_size];
  const int step = bw * bh;
  const int skip_ctx = av1_get_skip_txfm_context(xd);
  const int no_skip_txfm_cost = x->mode_costs.skip_txfm_cost[skip_ctx][0];
  const int skip_txfm_cost = x->mode_costs.skip_txfm_cost[skip_ctx][1];
  int64_t skip_txfm_rd = RDCOST(x->rdmult, skip_txfm_cost, 0);
  int64_t no_skip_txfm_rd = RDCOST(x->rdmult, no_skip_txfm_cost, 0);
  int block = 0;

  av1_init_rd_stats(rd_stats);
  for (int idy = 0; idy < max_block_high(xd, bsize, 0); idy += bh) {
    for (int idx = 0; idx < max_block_wide(xd, bsize, 0); idx += bw) {
      const int64_t best_rd_sofar =
          (rd_thresh == INT64_MAX)
              ? INT64_MAX
              : (rd_thresh - (AOMMIN(skip_txfm_rd, no_skip_txfm_rd)));
      int is_cost_valid = 1;
      RD_STATS pn_rd_stats;
      // Search for the best transform block size and type for the sub-block.
      select_tx_block(cpi, x, idy, idx, block, max_tx_size, init_depth, bsize,
                      ctxa, ctxl, tx_above, tx_left, &pn_rd_stats, INT64_MAX,
                      best_rd_sofar, &is_cost_valid, ftxs_mode);
      if (!is_cost_valid || pn_rd_stats.rate == INT_MAX) {
        av1_invalid_rd_stats(rd_stats);
        return INT64_MAX;
      }
      av1_merge_rd_stats(rd_stats, &pn_rd_stats);
      skip_txfm_rd = RDCOST(x->rdmult, skip_txfm_cost, rd_stats->sse);
      no_skip_txfm_rd =
          RDCOST(x->rdmult, rd_stats->rate + no_skip_txfm_cost, rd_stats->dist);
      block += step;
    }
  }

  if (rd_stats->rate == INT_MAX) return INT64_MAX;

  rd_stats->skip_txfm = (skip_txfm_rd <= no_skip_txfm_rd);

  // If fast_tx_search is true, only DCT and 1D DCT were tested in
  // select_inter_block_yrd() above. Do a better search for tx type with
  // tx sizes already decided.
  if (fast_tx_search && cpi->sf.tx_sf.refine_fast_tx_search_results) {
    if (!inter_block_yrd(cpi, x, rd_stats, bsize, ref_best_rd, FTXS_NONE))
      return INT64_MAX;
  }

  int64_t final_rd;
  if (rd_stats->skip_txfm) {
    final_rd = RDCOST(x->rdmult, skip_txfm_cost, rd_stats->sse);
  } else {
    final_rd =
        RDCOST(x->rdmult, rd_stats->rate + no_skip_txfm_cost, rd_stats->dist);
    if (!xd->lossless[xd->mi[0]->segment_id]) {
      final_rd =
          AOMMIN(final_rd, RDCOST(x->rdmult, skip_txfm_cost, rd_stats->sse));
    }
  }

  return final_rd;
}